

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

void __thiscall cpptempl::data_ptr::push_back(data_ptr *this,data_ptr *data)

{
  int iVar1;
  DataList *__p;
  undefined4 extraout_var;
  element_type *peVar2;
  vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_> local_38;
  
  peVar2 = (this->ptr).super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    __p = (DataList *)operator_new(0x20);
    local_38.super__Vector_base<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.super__Vector_base<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.super__Vector_base<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__p->super_Data)._vptr_Data = (_func_int **)&PTR_empty_0020b7b0;
    std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::vector
              (&__p->m_items,&local_38);
    std::__shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>::reset<cpptempl::DataList>
              (&(this->ptr).super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>,__p);
    std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::~vector(&local_38);
    peVar2 = (this->ptr).super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  iVar1 = (*peVar2->_vptr_Data[2])();
  std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::push_back
            ((vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_> *)
             CONCAT44(extraout_var,iVar1),data);
  return;
}

Assistant:

inline void data_ptr::push_back(const data_ptr& data) {
        if (!ptr) {
            ptr.reset(new DataList(data_list()));
        }
        data_list& list = ptr->getlist();
        list.push_back(data);
    }